

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O2

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_> * __thiscall
tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::
operator=(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
          *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>
                *p)

{
  if (this != p) {
    reset(this,p->_t);
    reset(p,(make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0);
  }
  return this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> & operator=(tchecker::intrusive_shared_ptr_t<T> && p)
  {
    if (this != &p) {
      reset(p._t);
      p.reset(nullptr);
    }
    return *this;
  }